

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

void __thiscall
VW::config::options_boost_po::insert(options_boost_po *this,string *key,string *value)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"--",key);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_command_line,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare((char *)value);
  if (iVar1 != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_command_line,value);
  }
  return;
}

Assistant:

virtual void insert(const std::string& key, const std::string& value) override
  {
    m_command_line.push_back("--" + key);
    if (value != "")
    {
      m_command_line.push_back(value);
    }
  }